

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_pad(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int padEnd)

{
  int iVar1;
  uint uVar2;
  int in_ECX;
  JSContext *in_RDI;
  long in_R8;
  int in_R9D;
  JSValue JVar3;
  JSValue JVar4;
  int chunk;
  int c;
  int len;
  int n;
  JSString *p1;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue v;
  JSValue str;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  JSValue in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff38 [16];
  int local_9c;
  JSValueUnion local_98;
  long lVar5;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  local_98.float64 = 0.0;
  JVar3 = JS_ToStringCheckObject
                    ((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff28);
  JVar4 = JVar3;
  iVar1 = JS_IsException(JVar3);
  lVar5 = in_stack_fffffffffffffff0._4_8_;
  if (iVar1 != 0) goto LAB_001bb8ef;
  iVar1 = JS_ToInt32Sat(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_,JVar4);
  lVar5 = in_stack_fffffffffffffff0._4_8_;
  if (iVar1 == 0) {
    uVar2 = (uint)*(undefined8 *)((long)JVar3.u.ptr + 4) & 0x7fffffff;
    if (local_9c <= (int)uVar2) {
      return JVar3;
    }
    if ((1 < in_ECX) && (iVar1 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10)), iVar1 == 0)) {
      JVar4.u._4_4_ = in_stack_ffffffffffffff1c;
      JVar4.u.int32 = in_stack_ffffffffffffff18;
      JVar4.tag._0_4_ = in_stack_ffffffffffffff20;
      JVar4.tag._4_4_ = in_stack_ffffffffffffff24;
      JVar4 = JS_ToString((JSContext *)0x1bb652,JVar4);
      local_98 = JVar4.u;
      iVar1 = JS_IsException(JVar4);
      lVar5 = in_stack_fffffffffffffff0._4_8_;
      if (iVar1 != 0) goto LAB_001bb8d2;
      if ((*(ulong *)((long)local_98.ptr + 4) & 0x7fffffff) == 0) {
        JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff28);
        return JVar3;
      }
      if (((uint)*(undefined8 *)((long)local_98.ptr + 4) & 0x7fffffff) == 1) {
        string_get((JSString *)local_98.ptr,0);
        local_98.float64 = 0.0;
      }
    }
    lVar5 = in_stack_fffffffffffffff0._4_8_;
    if (local_9c < 0x40000000) {
      iVar1 = string_buffer_init((JSContext *)
                                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                 (StringBuffer *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
      lVar5 = in_stack_fffffffffffffff0._4_8_;
      if (iVar1 == 0) {
        local_9c = local_9c - uVar2;
        if (in_R9D == 0) {
LAB_001bb7af:
          lVar5 = in_stack_fffffffffffffff0._4_8_;
          if (local_98.ptr == (void *)0x0) {
            iVar1 = string_buffer_fill((StringBuffer *)
                                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                                       ,0,0x1bb821);
            if (iVar1 != 0) goto LAB_001bb8ab;
          }
          else {
            for (; lVar5 = in_stack_fffffffffffffff0._4_8_, 0 < local_9c;
                local_9c = local_9c - in_stack_ffffffffffffff24) {
              in_stack_ffffffffffffff24 =
                   min_int(local_9c,(uint)*(undefined8 *)((long)local_98.ptr + 4) & 0x7fffffff);
              iVar1 = string_buffer_concat
                                ((StringBuffer *)in_stack_ffffffffffffff28.u.ptr,
                                 (JSString *)
                                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                 in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
              lVar5 = in_stack_fffffffffffffff0._4_8_;
              if (iVar1 != 0) goto LAB_001bb8ab;
            }
          }
          if ((in_R9D != 0) ||
             (iVar1 = string_buffer_concat
                                ((StringBuffer *)in_stack_ffffffffffffff28.u.ptr,
                                 (JSString *)
                                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                 in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18), iVar1 == 0))
          {
            JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff28);
            JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff28);
            JVar4 = string_buffer_end((StringBuffer *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
            ;
            return JVar4;
          }
        }
        else {
          iVar1 = string_buffer_concat
                            ((StringBuffer *)in_stack_ffffffffffffff28.u.ptr,
                             (JSString *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
          lVar5 = in_stack_fffffffffffffff0._4_8_;
          if (iVar1 == 0) goto LAB_001bb7af;
        }
LAB_001bb8ab:
        string_buffer_free((StringBuffer *)0x1bb8b5);
      }
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff28);
    }
    else {
      in_stack_ffffffffffffff28 = JS_ThrowInternalError(in_RDI,"string too long");
    }
  }
LAB_001bb8d2:
  JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28);
LAB_001bb8ef:
  JVar3.u.ptr = (void *)(lVar5 << 0x20);
  JVar3.tag = 6;
  return JVar3;
}

Assistant:

static JSValue js_string_pad(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int padEnd)
{
    JSValue str, v = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;
    JSString *p, *p1 = NULL;
    int n, len, c = ' ';

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail1;
    if (JS_ToInt32Sat(ctx, &n, argv[0]))
        goto fail2;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len >= n)
        return str;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        v = JS_ToString(ctx, argv[1]);
        if (JS_IsException(v))
            goto fail2;
        p1 = JS_VALUE_GET_STRING(v);
        if (p1->len == 0) {
            JS_FreeValue(ctx, v);
            return str;
        }
        if (p1->len == 1) {
            c = string_get(p1, 0);
            p1 = NULL;
        }
    }
    if (n > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail2;
    }
    if (string_buffer_init(ctx, b, n))
        goto fail3;
    n -= len;
    if (padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    if (p1) {
        while (n > 0) {
            int chunk = min_int(n, p1->len);
            if (string_buffer_concat(b, p1, 0, chunk))
                goto fail;
            n -= chunk;
        }
    } else {
        if (string_buffer_fill(b, c, n))
            goto fail;
    }
    if (!padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    JS_FreeValue(ctx, v);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
fail3:
    JS_FreeValue(ctx, v);
fail2:
    JS_FreeValue(ctx, str);
fail1:
    return JS_EXCEPTION;
}